

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

BOOL __thiscall Js::GlobalObject::HasOwnItem(GlobalObject *this,uint32 index)

{
  PropertyQueryFlags val;
  BOOL BVar1;
  RecyclableObject **ppRVar2;
  RecyclableObject *this_00;
  bool local_21;
  bool local_15;
  uint32 index_local;
  GlobalObject *this_local;
  
  val = DynamicObject::HasItemQuery((DynamicObject *)this,index);
  BVar1 = JavascriptConversion::PropertyQueryFlagsToBoolean(val);
  local_15 = true;
  if (BVar1 == 0) {
    ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                        ((WriteBarrierPtr *)&this->directHostObject);
    local_21 = false;
    if (*ppRVar2 != (RecyclableObject *)0x0) {
      this_00 = Memory::WriteBarrierPtr<Js::RecyclableObject>::operator->(&this->directHostObject);
      BVar1 = RecyclableObject::HasItem(this_00,index);
      local_21 = BVar1 != 0;
    }
    local_15 = local_21;
  }
  return (BOOL)local_15;
}

Assistant:

BOOL GlobalObject::HasOwnItem(uint32 index)
    {
        return JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::HasItemQuery(index))
            || (this->directHostObject && this->directHostObject->HasItem(index));
    }